

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_rec rf_get_collision_rec(rf_rec rec1,rf_rec rec2)

{
  rf_rec rVar1;
  float fVar2;
  float fVar3;
  _Bool _Var4;
  float dyy;
  float dxx;
  rf_rec rec2_local;
  rf_rec rec1_local;
  rf_rec retRec;
  
  rec2_local.width = rec1.x;
  rec2_local.height = rec1.y;
  rec1_local.x = rec1.width;
  rec1_local.y = rec1.height;
  dyy = rec2.x;
  dxx = rec2.y;
  rec2_local.x = rec2.width;
  rec2_local.y = rec2.height;
  rec1_local.width = 0.0;
  rec1_local.height = 0.0;
  retRec.x = 0.0;
  retRec.y = 0.0;
  _Var4 = rf_check_collision_recs(rec1,rec2);
  if (_Var4) {
    fVar2 = rec2_local.y;
    if (dyy < rec2_local.width) {
      if (dxx < rec2_local.height) {
        rec1_local.height = rec2_local.height;
      }
      else {
        rec1_local.height = dxx;
        fVar2 = rec1_local.y;
      }
      rec1_local.width = rec2_local.width;
      fVar3 = rec2_local.x;
    }
    else {
      if (dxx < rec2_local.height) {
        rec1_local.height = rec2_local.height;
      }
      else {
        rec1_local.height = dxx;
        fVar2 = rec1_local.y;
      }
      rec1_local.width = dyy;
      fVar3 = rec1_local.x;
    }
    retRec.y = fVar2 - ABS(rec2_local.height - dxx);
    retRec.x = fVar3 - ABS(rec2_local.width - dyy);
    if (rec1_local.x <= rec2_local.x) {
      if (rec1_local.x <= retRec.x) {
        retRec.x = rec1_local.x;
      }
    }
    else if (rec2_local.x <= retRec.x) {
      retRec.x = rec2_local.x;
    }
    if (rec1_local.y <= rec2_local.y) {
      if (rec1_local.y <= retRec.y) {
        retRec.y = rec1_local.y;
      }
    }
    else if (rec2_local.y <= retRec.y) {
      retRec.y = rec2_local.y;
    }
  }
  rVar1.y = rec1_local.height;
  rVar1.x = rec1_local.width;
  rVar1.width = retRec.x;
  rVar1.height = retRec.y;
  return rVar1;
}

Assistant:

rf_rec rf_get_collision_rec(rf_rec rec1, rf_rec rec2)
{
    rf_rec retRec = {0, 0, 0, 0};

    if (rf_check_collision_recs(rec1, rec2))
    {
        float dxx = (float) fabs(rec1.x - rec2.x);
        float dyy = (float) fabs(rec1.y - rec2.y);

        if (rec1.x <= rec2.x)
        {
            if (rec1.y <= rec2.y)
            {
                retRec.x = rec2.x;
                retRec.y = rec2.y;
                retRec.width = rec1.width - dxx;
                retRec.height = rec1.height - dyy;
            } else
            {
                retRec.x = rec2.x;
                retRec.y = rec1.y;
                retRec.width = rec1.width - dxx;
                retRec.height = rec2.height - dyy;
            }
        } else
        {
            if (rec1.y <= rec2.y)
            {
                retRec.x = rec1.x;
                retRec.y = rec2.y;
                retRec.width = rec2.width - dxx;
                retRec.height = rec1.height - dyy;
            } else
            {
                retRec.x = rec1.x;
                retRec.y = rec1.y;
                retRec.width = rec2.width - dxx;
                retRec.height = rec2.height - dyy;
            }
        }

        if (rec1.width > rec2.width)
        {
            if (retRec.width >= rec2.width) retRec.width = rec2.width;
        } else
        {
            if (retRec.width >= rec1.width) retRec.width = rec1.width;
        }

        if (rec1.height > rec2.height)
        {
            if (retRec.height >= rec2.height) retRec.height = rec2.height;
        } else
        {
            if (retRec.height >= rec1.height) retRec.height = rec1.height;
        }
    }

    return retRec;
}